

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<4,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::QuadMiIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  float **ppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined4 uVar80;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  ulong uVar93;
  long lVar94;
  byte bVar95;
  int iVar96;
  ulong uVar97;
  uint uVar98;
  ulong uVar99;
  ulong uVar100;
  ulong uVar101;
  ulong *puVar102;
  ulong uVar103;
  ulong uVar104;
  ulong uVar105;
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  vint4 bi;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  vint4 ai;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [64];
  float fVar124;
  float fVar128;
  float fVar129;
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar127 [64];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [64];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [64];
  undefined1 auVar144 [32];
  undefined1 auVar145 [64];
  float fVar146;
  undefined1 auVar147 [32];
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  undefined1 auVar148 [64];
  undefined1 auVar155 [32];
  uint uVar157;
  uint uVar158;
  uint uVar159;
  uint uVar160;
  uint uVar161;
  uint uVar162;
  uint uVar163;
  undefined1 auVar156 [64];
  undefined1 auVar164 [32];
  undefined1 auVar165 [64];
  float fVar166;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  undefined1 auVar167 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  int local_bd4;
  Scene *local_bd0;
  Geometry *local_bc8;
  ulong local_bc0;
  long local_bb8;
  ulong local_bb0;
  long local_ba8;
  undefined1 local_ba0 [32];
  float local_b80;
  float local_b7c;
  float local_b78;
  float local_b74;
  undefined4 local_b70;
  undefined4 local_b6c;
  uint local_b68;
  uint local_b64;
  uint local_b60;
  RTCFilterFunctionNArguments local_b50;
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [16];
  undefined1 local_a90 [16];
  undefined1 local_a80 [16];
  undefined1 local_a70 [16];
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  undefined1 local_a20 [32];
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  undefined1 local_9e0 [32];
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_8e0 [32];
  float local_8c0 [4];
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  undefined4 uStack_8a4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  float local_860 [4];
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  undefined4 uStack_844;
  float local_840 [4];
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined4 uStack_824;
  float local_820 [4];
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined4 uStack_804;
  ulong local_800;
  ulong local_7f8 [249];
  
  local_800 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_800 != 8) {
    fVar124 = ray->tfar;
    if (0.0 <= fVar124) {
      puVar102 = local_7f8;
      aVar3 = (ray->dir).field_0;
      auVar106 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar125._8_4_ = 0x7fffffff;
      auVar125._0_8_ = 0x7fffffff7fffffff;
      auVar125._12_4_ = 0x7fffffff;
      auVar125 = vandps_avx((undefined1  [16])aVar3,auVar125);
      auVar136._8_4_ = 0x219392ef;
      auVar136._0_8_ = 0x219392ef219392ef;
      auVar136._12_4_ = 0x219392ef;
      auVar125 = vcmpps_avx(auVar125,auVar136,1);
      auVar125 = vblendvps_avx((undefined1  [16])aVar3,auVar136,auVar125);
      auVar136 = vrcpps_avx(auVar125);
      fVar129 = auVar136._0_4_;
      auVar121._0_4_ = fVar129 * auVar125._0_4_;
      fVar130 = auVar136._4_4_;
      auVar121._4_4_ = fVar130 * auVar125._4_4_;
      fVar131 = auVar136._8_4_;
      auVar121._8_4_ = fVar131 * auVar125._8_4_;
      fVar133 = auVar136._12_4_;
      auVar121._12_4_ = fVar133 * auVar125._12_4_;
      auVar137._8_4_ = 0x3f800000;
      auVar137._0_8_ = 0x3f8000003f800000;
      auVar137._12_4_ = 0x3f800000;
      auVar125 = vsubps_avx(auVar137,auVar121);
      auVar122._0_4_ = fVar129 + fVar129 * auVar125._0_4_;
      auVar122._4_4_ = fVar130 + fVar130 * auVar125._4_4_;
      auVar122._8_4_ = fVar131 + fVar131 * auVar125._8_4_;
      auVar122._12_4_ = fVar133 + fVar133 * auVar125._12_4_;
      uVar1 = *(undefined4 *)&(ray->org).field_0;
      local_a30._4_4_ = uVar1;
      local_a30._0_4_ = uVar1;
      local_a30._8_4_ = uVar1;
      local_a30._12_4_ = uVar1;
      auVar143 = ZEXT1664(local_a30);
      uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_a40._4_4_ = uVar1;
      local_a40._0_4_ = uVar1;
      local_a40._8_4_ = uVar1;
      local_a40._12_4_ = uVar1;
      auVar145 = ZEXT1664(local_a40);
      uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_a50._4_4_ = uVar1;
      local_a50._0_4_ = uVar1;
      local_a50._8_4_ = uVar1;
      local_a50._12_4_ = uVar1;
      auVar148 = ZEXT1664(local_a50);
      local_a60 = vshufps_avx(auVar122,auVar122,0);
      auVar156 = ZEXT1664(local_a60);
      auVar125 = vmovshdup_avx(auVar122);
      local_a70 = vshufps_avx(auVar122,auVar122,0x55);
      auVar165 = ZEXT1664(local_a70);
      auVar136 = vshufpd_avx(auVar122,auVar122,1);
      uVar103 = (ulong)(auVar122._0_4_ < 0.0) << 4;
      uVar101 = (ulong)(auVar125._0_4_ < 0.0) << 4 | 0x20;
      local_a80 = vshufps_avx(auVar122,auVar122,0xaa);
      auVar123 = ZEXT1664(local_a80);
      uVar104 = (ulong)(auVar136._0_4_ < 0.0) << 4 | 0x40;
      uVar105 = uVar103 ^ 0x10;
      local_a90 = vshufps_avx(auVar106,auVar106,0);
      auVar127 = ZEXT1664(local_a90);
      local_a20._16_16_ = mm_lookupmask_ps._240_16_;
      local_a20._0_16_ = mm_lookupmask_ps._240_16_;
      local_9e0 = vperm2f128_avx(local_a20,mm_lookupmask_ps._0_32_,2);
      local_aa0 = vshufps_avx(ZEXT416((uint)fVar124),ZEXT416((uint)fVar124),0);
      auVar140 = ZEXT1664(local_aa0);
      auVar107._8_4_ = 0xbf800000;
      auVar107._0_8_ = 0xbf800000bf800000;
      auVar107._12_4_ = 0xbf800000;
      auVar107._16_4_ = 0xbf800000;
      auVar107._20_4_ = 0xbf800000;
      auVar107._24_4_ = 0xbf800000;
      auVar107._28_4_ = 0xbf800000;
      auVar118._8_4_ = 0x3f800000;
      auVar118._0_8_ = 0x3f8000003f800000;
      auVar118._12_4_ = 0x3f800000;
      auVar118._16_4_ = 0x3f800000;
      auVar118._20_4_ = 0x3f800000;
      auVar118._24_4_ = 0x3f800000;
      auVar118._28_4_ = 0x3f800000;
      _local_a00 = vblendvps_avx(auVar118,auVar107,local_9e0);
      local_bb0 = uVar101;
      uVar99 = uVar101;
LAB_002c3b14:
      do {
        uVar100 = puVar102[-1];
        puVar102 = puVar102 + -1;
        while ((uVar100 & 8) == 0) {
          auVar125 = vsubps_avx(*(undefined1 (*) [16])(uVar100 + 0x20 + uVar103),auVar143._0_16_);
          auVar106._0_4_ = auVar156._0_4_ * auVar125._0_4_;
          auVar106._4_4_ = auVar156._4_4_ * auVar125._4_4_;
          auVar106._8_4_ = auVar156._8_4_ * auVar125._8_4_;
          auVar106._12_4_ = auVar156._12_4_ * auVar125._12_4_;
          auVar125 = vsubps_avx(*(undefined1 (*) [16])(uVar100 + 0x20 + uVar99),auVar145._0_16_);
          auVar109._0_4_ = auVar165._0_4_ * auVar125._0_4_;
          auVar109._4_4_ = auVar165._4_4_ * auVar125._4_4_;
          auVar109._8_4_ = auVar165._8_4_ * auVar125._8_4_;
          auVar109._12_4_ = auVar165._12_4_ * auVar125._12_4_;
          auVar125 = vpmaxsd_avx(auVar106,auVar109);
          auVar106 = vsubps_avx(*(undefined1 (*) [16])(uVar100 + 0x20 + uVar104),auVar148._0_16_);
          auVar110._0_4_ = auVar123._0_4_ * auVar106._0_4_;
          auVar110._4_4_ = auVar123._4_4_ * auVar106._4_4_;
          auVar110._8_4_ = auVar123._8_4_ * auVar106._8_4_;
          auVar110._12_4_ = auVar123._12_4_ * auVar106._12_4_;
          auVar106 = vpmaxsd_avx(auVar110,auVar127._0_16_);
          auVar125 = vpmaxsd_avx(auVar125,auVar106);
          auVar106 = vsubps_avx(*(undefined1 (*) [16])(uVar100 + 0x20 + uVar105),auVar143._0_16_);
          auVar111._0_4_ = auVar156._0_4_ * auVar106._0_4_;
          auVar111._4_4_ = auVar156._4_4_ * auVar106._4_4_;
          auVar111._8_4_ = auVar156._8_4_ * auVar106._8_4_;
          auVar111._12_4_ = auVar156._12_4_ * auVar106._12_4_;
          auVar106 = vsubps_avx(*(undefined1 (*) [16])(uVar100 + 0x20 + (uVar101 ^ 0x10)),
                                auVar145._0_16_);
          auVar116._0_4_ = auVar165._0_4_ * auVar106._0_4_;
          auVar116._4_4_ = auVar165._4_4_ * auVar106._4_4_;
          auVar116._8_4_ = auVar165._8_4_ * auVar106._8_4_;
          auVar116._12_4_ = auVar165._12_4_ * auVar106._12_4_;
          auVar106 = vpminsd_avx(auVar111,auVar116);
          auVar136 = vsubps_avx(*(undefined1 (*) [16])(uVar100 + 0x20 + (uVar104 ^ 0x10)),
                                auVar148._0_16_);
          auVar117._0_4_ = auVar123._0_4_ * auVar136._0_4_;
          auVar117._4_4_ = auVar123._4_4_ * auVar136._4_4_;
          auVar117._8_4_ = auVar123._8_4_ * auVar136._8_4_;
          auVar117._12_4_ = auVar123._12_4_ * auVar136._12_4_;
          auVar136 = vpminsd_avx(auVar117,auVar140._0_16_);
          auVar106 = vpminsd_avx(auVar106,auVar136);
          auVar125 = vpcmpgtd_avx(auVar125,auVar106);
          iVar96 = vmovmskps_avx(auVar125);
          if (iVar96 == 0xf) {
            if (puVar102 == &local_800) {
              return;
            }
            goto LAB_002c3b14;
          }
          bVar95 = (byte)iVar96 ^ 0xf;
          uVar93 = uVar100 & 0xfffffffffffffff0;
          lVar9 = 0;
          if (bVar95 != 0) {
            for (; (bVar95 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
            }
          }
          uVar100 = *(ulong *)(uVar93 + lVar9 * 8);
          uVar98 = bVar95 - 1 & (uint)bVar95;
          if (uVar98 != 0) {
            *puVar102 = uVar100;
            puVar102 = puVar102 + 1;
            lVar9 = 0;
            if (uVar98 != 0) {
              for (; (uVar98 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
              }
            }
            uVar100 = *(ulong *)(uVar93 + lVar9 * 8);
            uVar98 = uVar98 - 1 & uVar98;
            uVar97 = (ulong)uVar98;
            if (uVar98 != 0) {
              do {
                *puVar102 = uVar100;
                puVar102 = puVar102 + 1;
                lVar9 = 0;
                if (uVar97 != 0) {
                  for (; (uVar97 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
                  }
                }
                uVar100 = *(ulong *)(uVar93 + lVar9 * 8);
                uVar97 = uVar97 & uVar97 - 1;
              } while (uVar97 != 0);
            }
          }
        }
        local_ba8 = (ulong)((uint)uVar100 & 0xf) - 8;
        if (local_ba8 != 0) {
          uVar100 = uVar100 & 0xfffffffffffffff0;
          local_bd0 = context->scene;
          local_bb8 = 0;
          do {
            lVar94 = local_bb8 * 0x60;
            ppfVar4 = (local_bd0->vertices).items;
            pfVar5 = ppfVar4[*(uint *)(uVar100 + 0x40 + lVar94)];
            pfVar6 = ppfVar4[*(uint *)(uVar100 + 0x44 + lVar94)];
            pfVar7 = ppfVar4[*(uint *)(uVar100 + 0x48 + lVar94)];
            pfVar8 = ppfVar4[*(uint *)(uVar100 + 0x4c + lVar94)];
            auVar136 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar100 + lVar94)),
                                     *(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar100 + 8 + lVar94)));
            auVar125 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar100 + lVar94)),
                                     *(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar100 + 8 + lVar94)));
            auVar121 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar100 + 4 + lVar94)),
                                     *(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar100 + 0xc + lVar94)));
            auVar106 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar100 + 4 + lVar94)),
                                     *(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar100 + 0xc + lVar94)));
            auVar137 = vunpcklps_avx(auVar125,auVar106);
            auVar109 = vunpcklps_avx(auVar136,auVar121);
            auVar125 = vunpckhps_avx(auVar136,auVar121);
            auVar121 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar5 + *(uint *)(uVar100 + 0x10 + lVar94)),
                                     *(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar100 + 0x18 + lVar94)));
            auVar106 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar5 + *(uint *)(uVar100 + 0x10 + lVar94)),
                                     *(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar100 + 0x18 + lVar94)));
            auVar122 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar100 + 0x14 + lVar94)),
                                     *(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar100 + 0x1c + lVar94)));
            auVar136 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar100 + 0x14 + lVar94)),
                                     *(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar100 + 0x1c + lVar94)));
            auVar110 = vunpcklps_avx(auVar106,auVar136);
            auVar111 = vunpcklps_avx(auVar121,auVar122);
            auVar106 = vunpckhps_avx(auVar121,auVar122);
            auVar122 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar5 + *(uint *)(uVar100 + 0x20 + lVar94)),
                                     *(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar100 + 0x28 + lVar94)));
            auVar136 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar5 + *(uint *)(uVar100 + 0x20 + lVar94)),
                                     *(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar100 + 0x28 + lVar94)));
            auVar116 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar100 + 0x24 + lVar94)),
                                     *(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar100 + 0x2c + lVar94)));
            auVar121 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar100 + 0x24 + lVar94)),
                                     *(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar100 + 0x2c + lVar94)));
            auVar117 = vunpcklps_avx(auVar136,auVar121);
            auVar77 = vunpcklps_avx(auVar122,auVar116);
            auVar136 = vunpckhps_avx(auVar122,auVar116);
            auVar116 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar5 + *(uint *)(uVar100 + 0x30 + lVar94)),
                                     *(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar100 + 0x38 + lVar94)));
            auVar121 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar5 + *(uint *)(uVar100 + 0x30 + lVar94)),
                                     *(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar100 + 0x38 + lVar94)));
            auVar78 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar100 + 0x34 + lVar94)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar100 + 0x3c + lVar94)));
            auVar122 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar100 + 0x34 + lVar94)),
                                     *(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar100 + 0x3c + lVar94)));
            auVar122 = vunpcklps_avx(auVar121,auVar122);
            auVar79 = vunpcklps_avx(auVar116,auVar78);
            auVar121 = vunpckhps_avx(auVar116,auVar78);
            lVar9 = uVar100 + 0x40 + lVar94;
            local_9a0 = *(undefined8 *)(lVar9 + 0x10);
            uStack_998 = *(undefined8 *)(lVar9 + 0x18);
            uStack_990 = local_9a0;
            uStack_988 = uStack_998;
            lVar94 = uVar100 + 0x50 + lVar94;
            local_9c0 = *(undefined8 *)(lVar94 + 0x10);
            uStack_9b8 = *(undefined8 *)(lVar94 + 0x18);
            uStack_9b0 = local_9c0;
            uStack_9a8 = uStack_9b8;
            auVar126._16_16_ = auVar77;
            auVar126._0_16_ = auVar109;
            auVar138._16_16_ = auVar136;
            auVar138._0_16_ = auVar125;
            auVar144._16_16_ = auVar117;
            auVar144._0_16_ = auVar137;
            auVar112._16_16_ = auVar111;
            auVar112._0_16_ = auVar111;
            auVar141._16_16_ = auVar106;
            auVar141._0_16_ = auVar106;
            auVar119._16_16_ = auVar110;
            auVar119._0_16_ = auVar110;
            auVar155._16_16_ = auVar79;
            auVar155._0_16_ = auVar79;
            auVar164._16_16_ = auVar121;
            auVar164._0_16_ = auVar121;
            auVar108._16_16_ = auVar122;
            auVar108._0_16_ = auVar122;
            local_ba0 = vsubps_avx(auVar126,auVar112);
            local_b00 = vsubps_avx(auVar138,auVar141);
            auVar107 = vsubps_avx(auVar144,auVar119);
            auVar118 = vsubps_avx(auVar155,auVar126);
            auVar112 = vsubps_avx(auVar164,auVar138);
            auVar108 = vsubps_avx(auVar108,auVar144);
            fVar131 = auVar108._0_4_;
            fVar166 = local_b00._0_4_;
            fVar14 = auVar108._4_4_;
            fVar168 = local_b00._4_4_;
            auVar74._4_4_ = fVar168 * fVar14;
            auVar74._0_4_ = fVar166 * fVar131;
            fVar24 = auVar108._8_4_;
            fVar169 = local_b00._8_4_;
            auVar74._8_4_ = fVar169 * fVar24;
            fVar34 = auVar108._12_4_;
            fVar170 = local_b00._12_4_;
            auVar74._12_4_ = fVar170 * fVar34;
            fVar44 = auVar108._16_4_;
            fVar171 = local_b00._16_4_;
            auVar74._16_4_ = fVar171 * fVar44;
            fVar54 = auVar108._20_4_;
            fVar172 = local_b00._20_4_;
            auVar74._20_4_ = fVar172 * fVar54;
            fVar64 = auVar108._24_4_;
            fVar173 = local_b00._24_4_;
            auVar74._24_4_ = fVar173 * fVar64;
            auVar74._28_4_ = auVar122._12_4_;
            fVar133 = auVar112._0_4_;
            fVar146 = auVar107._0_4_;
            fVar15 = auVar112._4_4_;
            fVar149 = auVar107._4_4_;
            auVar75._4_4_ = fVar149 * fVar15;
            auVar75._0_4_ = fVar146 * fVar133;
            fVar25 = auVar112._8_4_;
            fVar150 = auVar107._8_4_;
            auVar75._8_4_ = fVar150 * fVar25;
            fVar35 = auVar112._12_4_;
            fVar151 = auVar107._12_4_;
            auVar75._12_4_ = fVar151 * fVar35;
            fVar45 = auVar112._16_4_;
            fVar152 = auVar107._16_4_;
            auVar75._16_4_ = fVar152 * fVar45;
            fVar55 = auVar112._20_4_;
            fVar153 = auVar107._20_4_;
            auVar75._20_4_ = fVar153 * fVar55;
            fVar65 = auVar112._24_4_;
            uVar80 = auVar111._12_4_;
            fVar154 = auVar107._24_4_;
            auVar75._24_4_ = fVar154 * fVar65;
            auVar75._28_4_ = uVar80;
            local_ac0 = vsubps_avx(auVar75,auVar74);
            fVar135 = auVar118._0_4_;
            fVar16 = auVar118._4_4_;
            auVar76._4_4_ = fVar149 * fVar16;
            auVar76._0_4_ = fVar146 * fVar135;
            fVar26 = auVar118._8_4_;
            auVar76._8_4_ = fVar150 * fVar26;
            fVar36 = auVar118._12_4_;
            auVar76._12_4_ = fVar151 * fVar36;
            fVar46 = auVar118._16_4_;
            auVar76._16_4_ = fVar152 * fVar46;
            fVar56 = auVar118._20_4_;
            auVar76._20_4_ = fVar153 * fVar56;
            fVar66 = auVar118._24_4_;
            auVar76._24_4_ = fVar154 * fVar66;
            auVar76._28_4_ = uVar80;
            fVar132 = local_ba0._0_4_;
            fVar17 = local_ba0._4_4_;
            auVar81._4_4_ = fVar14 * fVar17;
            auVar81._0_4_ = fVar131 * fVar132;
            fVar27 = local_ba0._8_4_;
            auVar81._8_4_ = fVar24 * fVar27;
            fVar37 = local_ba0._12_4_;
            auVar81._12_4_ = fVar34 * fVar37;
            fVar47 = local_ba0._16_4_;
            auVar81._16_4_ = fVar44 * fVar47;
            fVar57 = local_ba0._20_4_;
            auVar81._20_4_ = fVar54 * fVar57;
            fVar67 = local_ba0._24_4_;
            auVar81._24_4_ = fVar64 * fVar67;
            auVar81._28_4_ = auVar110._12_4_;
            auVar107 = vsubps_avx(auVar81,auVar76);
            auVar82._4_4_ = fVar15 * fVar17;
            auVar82._0_4_ = fVar133 * fVar132;
            auVar82._8_4_ = fVar25 * fVar27;
            auVar82._12_4_ = fVar35 * fVar37;
            auVar82._16_4_ = fVar45 * fVar47;
            auVar82._20_4_ = fVar55 * fVar57;
            auVar82._24_4_ = fVar65 * fVar67;
            auVar82._28_4_ = auVar110._12_4_;
            auVar83._4_4_ = fVar168 * fVar16;
            auVar83._0_4_ = fVar166 * fVar135;
            auVar83._8_4_ = fVar169 * fVar26;
            auVar83._12_4_ = fVar170 * fVar36;
            auVar83._16_4_ = fVar171 * fVar46;
            auVar83._20_4_ = fVar172 * fVar56;
            auVar83._24_4_ = fVar173 * fVar66;
            auVar83._28_4_ = local_b00._28_4_;
            local_b20 = vsubps_avx(auVar83,auVar82);
            uVar1 = *(undefined4 *)&(ray->org).field_0;
            auVar167._4_4_ = uVar1;
            auVar167._0_4_ = uVar1;
            auVar167._8_4_ = uVar1;
            auVar167._12_4_ = uVar1;
            auVar167._16_4_ = uVar1;
            auVar167._20_4_ = uVar1;
            auVar167._24_4_ = uVar1;
            auVar167._28_4_ = uVar1;
            uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
            auVar174._4_4_ = uVar1;
            auVar174._0_4_ = uVar1;
            auVar174._8_4_ = uVar1;
            auVar174._12_4_ = uVar1;
            auVar174._16_4_ = uVar1;
            auVar174._20_4_ = uVar1;
            auVar174._24_4_ = uVar1;
            auVar174._28_4_ = uVar1;
            uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
            auVar175._4_4_ = uVar2;
            auVar175._0_4_ = uVar2;
            auVar175._8_4_ = uVar2;
            auVar175._12_4_ = uVar2;
            auVar175._16_4_ = uVar2;
            auVar175._20_4_ = uVar2;
            auVar175._24_4_ = uVar2;
            auVar175._28_4_ = uVar2;
            fVar124 = (ray->dir).field_0.m128[1];
            local_ae0 = vsubps_avx(auVar126,auVar167);
            fVar129 = (ray->dir).field_0.m128[2];
            auVar74 = vsubps_avx(auVar138,auVar174);
            auVar75 = vsubps_avx(auVar144,auVar175);
            fVar134 = auVar75._0_4_;
            fVar18 = auVar75._4_4_;
            auVar84._4_4_ = fVar124 * fVar18;
            auVar84._0_4_ = fVar124 * fVar134;
            fVar28 = auVar75._8_4_;
            auVar84._8_4_ = fVar124 * fVar28;
            fVar38 = auVar75._12_4_;
            auVar84._12_4_ = fVar124 * fVar38;
            fVar48 = auVar75._16_4_;
            auVar84._16_4_ = fVar124 * fVar48;
            fVar58 = auVar75._20_4_;
            auVar84._20_4_ = fVar124 * fVar58;
            fVar68 = auVar75._24_4_;
            auVar84._24_4_ = fVar124 * fVar68;
            auVar84._28_4_ = uVar1;
            fVar128 = auVar74._0_4_;
            fVar19 = auVar74._4_4_;
            auVar85._4_4_ = fVar129 * fVar19;
            auVar85._0_4_ = fVar129 * fVar128;
            fVar29 = auVar74._8_4_;
            auVar85._8_4_ = fVar129 * fVar29;
            fVar39 = auVar74._12_4_;
            auVar85._12_4_ = fVar129 * fVar39;
            fVar49 = auVar74._16_4_;
            auVar85._16_4_ = fVar129 * fVar49;
            fVar59 = auVar74._20_4_;
            auVar85._20_4_ = fVar129 * fVar59;
            fVar69 = auVar74._24_4_;
            auVar85._24_4_ = fVar129 * fVar69;
            auVar85._28_4_ = uVar2;
            auVar74 = vsubps_avx(auVar85,auVar84);
            fVar130 = (ray->dir).field_0.m128[0];
            fVar10 = local_ae0._0_4_;
            fVar20 = local_ae0._4_4_;
            auVar86._4_4_ = fVar129 * fVar20;
            auVar86._0_4_ = fVar129 * fVar10;
            fVar30 = local_ae0._8_4_;
            auVar86._8_4_ = fVar129 * fVar30;
            fVar40 = local_ae0._12_4_;
            auVar86._12_4_ = fVar129 * fVar40;
            fVar50 = local_ae0._16_4_;
            auVar86._16_4_ = fVar129 * fVar50;
            fVar60 = local_ae0._20_4_;
            auVar86._20_4_ = fVar129 * fVar60;
            fVar70 = local_ae0._24_4_;
            auVar86._24_4_ = fVar129 * fVar70;
            auVar86._28_4_ = local_ac0._28_4_;
            auVar87._4_4_ = fVar130 * fVar18;
            auVar87._0_4_ = fVar130 * fVar134;
            auVar87._8_4_ = fVar130 * fVar28;
            auVar87._12_4_ = fVar130 * fVar38;
            auVar87._16_4_ = fVar130 * fVar48;
            auVar87._20_4_ = fVar130 * fVar58;
            auVar87._24_4_ = fVar130 * fVar68;
            auVar87._28_4_ = uVar80;
            auVar75 = vsubps_avx(auVar87,auVar86);
            auVar88._4_4_ = fVar130 * fVar19;
            auVar88._0_4_ = fVar130 * fVar128;
            auVar88._8_4_ = fVar130 * fVar29;
            auVar88._12_4_ = fVar130 * fVar39;
            auVar88._16_4_ = fVar130 * fVar49;
            auVar88._20_4_ = fVar130 * fVar59;
            auVar88._24_4_ = fVar130 * fVar69;
            auVar88._28_4_ = uVar80;
            auVar89._4_4_ = fVar124 * fVar20;
            auVar89._0_4_ = fVar124 * fVar10;
            auVar89._8_4_ = fVar124 * fVar30;
            auVar89._12_4_ = fVar124 * fVar40;
            auVar89._16_4_ = fVar124 * fVar50;
            auVar89._20_4_ = fVar124 * fVar60;
            auVar89._24_4_ = fVar124 * fVar70;
            auVar89._28_4_ = local_ae0._28_4_;
            auVar76 = vsubps_avx(auVar89,auVar88);
            fVar11 = local_b20._0_4_;
            fVar21 = local_b20._4_4_;
            fVar31 = local_b20._8_4_;
            fVar41 = local_b20._12_4_;
            fVar51 = local_b20._16_4_;
            fVar61 = local_b20._20_4_;
            fVar71 = local_b20._24_4_;
            fVar12 = auVar107._0_4_;
            fVar22 = auVar107._4_4_;
            fVar32 = auVar107._8_4_;
            fVar42 = auVar107._12_4_;
            fVar52 = auVar107._16_4_;
            fVar62 = auVar107._20_4_;
            fVar72 = auVar107._24_4_;
            fVar13 = local_ac0._0_4_;
            fVar23 = local_ac0._4_4_;
            fVar33 = local_ac0._8_4_;
            fVar43 = local_ac0._12_4_;
            fVar53 = local_ac0._16_4_;
            fVar63 = local_ac0._20_4_;
            fVar73 = local_ac0._24_4_;
            auVar120._0_4_ = fVar130 * fVar13 + fVar124 * fVar12 + fVar129 * fVar11;
            auVar120._4_4_ = fVar130 * fVar23 + fVar124 * fVar22 + fVar129 * fVar21;
            auVar120._8_4_ = fVar130 * fVar33 + fVar124 * fVar32 + fVar129 * fVar31;
            auVar120._12_4_ = fVar130 * fVar43 + fVar124 * fVar42 + fVar129 * fVar41;
            auVar120._16_4_ = fVar130 * fVar53 + fVar124 * fVar52 + fVar129 * fVar51;
            auVar120._20_4_ = fVar130 * fVar63 + fVar124 * fVar62 + fVar129 * fVar61;
            auVar120._24_4_ = fVar130 * fVar73 + fVar124 * fVar72 + fVar129 * fVar71;
            auVar120._28_4_ = fVar129 + fVar129 + local_ae0._28_4_;
            auVar113._8_4_ = 0x80000000;
            auVar113._0_8_ = 0x8000000080000000;
            auVar113._12_4_ = 0x80000000;
            auVar113._16_4_ = 0x80000000;
            auVar113._20_4_ = 0x80000000;
            auVar113._24_4_ = 0x80000000;
            auVar113._28_4_ = 0x80000000;
            auVar107 = vandps_avx(auVar120,auVar113);
            uVar98 = auVar107._0_4_;
            auVar142._0_4_ =
                 (float)(uVar98 ^ (uint)(fVar135 * auVar74._0_4_ +
                                        fVar133 * auVar75._0_4_ + fVar131 * auVar76._0_4_));
            uVar157 = auVar107._4_4_;
            auVar142._4_4_ =
                 (float)(uVar157 ^
                        (uint)(fVar16 * auVar74._4_4_ +
                              fVar15 * auVar75._4_4_ + fVar14 * auVar76._4_4_));
            uVar158 = auVar107._8_4_;
            auVar142._8_4_ =
                 (float)(uVar158 ^
                        (uint)(fVar26 * auVar74._8_4_ +
                              fVar25 * auVar75._8_4_ + fVar24 * auVar76._8_4_));
            uVar159 = auVar107._12_4_;
            auVar142._12_4_ =
                 (float)(uVar159 ^
                        (uint)(fVar36 * auVar74._12_4_ +
                              fVar35 * auVar75._12_4_ + fVar34 * auVar76._12_4_));
            uVar160 = auVar107._16_4_;
            auVar142._16_4_ =
                 (float)(uVar160 ^
                        (uint)(fVar46 * auVar74._16_4_ +
                              fVar45 * auVar75._16_4_ + fVar44 * auVar76._16_4_));
            uVar161 = auVar107._20_4_;
            auVar142._20_4_ =
                 (float)(uVar161 ^
                        (uint)(fVar56 * auVar74._20_4_ +
                              fVar55 * auVar75._20_4_ + fVar54 * auVar76._20_4_));
            uVar162 = auVar107._24_4_;
            auVar142._24_4_ =
                 (float)(uVar162 ^
                        (uint)(fVar66 * auVar74._24_4_ +
                              fVar65 * auVar75._24_4_ + fVar64 * auVar76._24_4_));
            uVar163 = auVar107._28_4_;
            auVar142._28_4_ =
                 (float)(uVar163 ^ (uint)(auVar118._28_4_ + auVar112._28_4_ + auVar108._28_4_));
            auVar147._0_4_ =
                 (float)(uVar98 ^ (uint)(auVar74._0_4_ * fVar132 +
                                        auVar75._0_4_ * fVar166 + fVar146 * auVar76._0_4_));
            auVar147._4_4_ =
                 (float)(uVar157 ^
                        (uint)(auVar74._4_4_ * fVar17 +
                              auVar75._4_4_ * fVar168 + fVar149 * auVar76._4_4_));
            auVar147._8_4_ =
                 (float)(uVar158 ^
                        (uint)(auVar74._8_4_ * fVar27 +
                              auVar75._8_4_ * fVar169 + fVar150 * auVar76._8_4_));
            auVar147._12_4_ =
                 (float)(uVar159 ^
                        (uint)(auVar74._12_4_ * fVar37 +
                              auVar75._12_4_ * fVar170 + fVar151 * auVar76._12_4_));
            auVar147._16_4_ =
                 (float)(uVar160 ^
                        (uint)(auVar74._16_4_ * fVar47 +
                              auVar75._16_4_ * fVar171 + fVar152 * auVar76._16_4_));
            auVar147._20_4_ =
                 (float)(uVar161 ^
                        (uint)(auVar74._20_4_ * fVar57 +
                              auVar75._20_4_ * fVar172 + fVar153 * auVar76._20_4_));
            auVar147._24_4_ =
                 (float)(uVar162 ^
                        (uint)(auVar74._24_4_ * fVar67 +
                              auVar75._24_4_ * fVar173 + fVar154 * auVar76._24_4_));
            auVar147._28_4_ = (float)(uVar163 ^ (uint)(auVar75._28_4_ + auVar76._28_4_ + -0.0));
            auVar118 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar107 = vcmpps_avx(auVar142,auVar118,5);
            auVar118 = vcmpps_avx(auVar147,auVar118,5);
            auVar107 = vandps_avx(auVar107,auVar118);
            auVar114._8_4_ = 0x7fffffff;
            auVar114._0_8_ = 0x7fffffff7fffffff;
            auVar114._12_4_ = 0x7fffffff;
            auVar114._16_4_ = 0x7fffffff;
            auVar114._20_4_ = 0x7fffffff;
            auVar114._24_4_ = 0x7fffffff;
            auVar114._28_4_ = 0x7fffffff;
            local_920 = vandps_avx(auVar120,auVar114);
            auVar118 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar120,4);
            auVar107 = vandps_avx(auVar107,auVar118);
            auVar115._0_4_ = auVar147._0_4_ + auVar142._0_4_;
            auVar115._4_4_ = auVar147._4_4_ + auVar142._4_4_;
            auVar115._8_4_ = auVar147._8_4_ + auVar142._8_4_;
            auVar115._12_4_ = auVar147._12_4_ + auVar142._12_4_;
            auVar115._16_4_ = auVar147._16_4_ + auVar142._16_4_;
            auVar115._20_4_ = auVar147._20_4_ + auVar142._20_4_;
            auVar115._24_4_ = auVar147._24_4_ + auVar142._24_4_;
            auVar115._28_4_ = auVar147._28_4_ + auVar142._28_4_;
            auVar112 = vcmpps_avx(auVar115,local_920,2);
            auVar118 = vandps_avx(auVar107,auVar112);
            auVar108 = local_a20 & auVar118;
            if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar108 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar108 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar108 >> 0x7f,0) != '\0') ||
                  (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar108 >> 0xbf,0) != '\0') ||
                (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar108[0x1f] < '\0') {
              auVar118 = vandps_avx(auVar118,local_a20);
              local_940._0_4_ =
                   (float)(uVar98 ^ (uint)(fVar13 * fVar10 + fVar12 * fVar128 + fVar134 * fVar11));
              local_940._4_4_ =
                   (float)(uVar157 ^ (uint)(fVar23 * fVar20 + fVar22 * fVar19 + fVar18 * fVar21));
              local_940._8_4_ =
                   (float)(uVar158 ^ (uint)(fVar33 * fVar30 + fVar32 * fVar29 + fVar28 * fVar31));
              local_940._12_4_ =
                   (float)(uVar159 ^ (uint)(fVar43 * fVar40 + fVar42 * fVar39 + fVar38 * fVar41));
              local_940._16_4_ =
                   (float)(uVar160 ^ (uint)(fVar53 * fVar50 + fVar52 * fVar49 + fVar48 * fVar51));
              local_940._20_4_ =
                   (float)(uVar161 ^ (uint)(fVar63 * fVar60 + fVar62 * fVar59 + fVar58 * fVar61));
              local_940._24_4_ =
                   (float)(uVar162 ^ (uint)(fVar73 * fVar70 + fVar72 * fVar69 + fVar68 * fVar71));
              local_940._28_4_ =
                   uVar163 ^ (uint)(auVar112._28_4_ + auVar112._28_4_ + auVar107._28_4_);
              fVar124 = (ray->org).field_0.m128[3];
              fVar129 = local_920._0_4_;
              fVar130 = local_920._4_4_;
              auVar90._4_4_ = fVar130 * fVar124;
              auVar90._0_4_ = fVar129 * fVar124;
              fVar131 = local_920._8_4_;
              auVar90._8_4_ = fVar131 * fVar124;
              fVar133 = local_920._12_4_;
              auVar90._12_4_ = fVar133 * fVar124;
              fVar135 = local_920._16_4_;
              auVar90._16_4_ = fVar135 * fVar124;
              fVar132 = local_920._20_4_;
              auVar90._20_4_ = fVar132 * fVar124;
              fVar134 = local_920._24_4_;
              auVar90._24_4_ = fVar134 * fVar124;
              auVar90._28_4_ = fVar124;
              auVar107 = vcmpps_avx(auVar90,local_940,1);
              fVar124 = ray->tfar;
              auVar91._4_4_ = fVar130 * fVar124;
              auVar91._0_4_ = fVar129 * fVar124;
              auVar91._8_4_ = fVar131 * fVar124;
              auVar91._12_4_ = fVar133 * fVar124;
              auVar91._16_4_ = fVar135 * fVar124;
              auVar91._20_4_ = fVar132 * fVar124;
              auVar91._24_4_ = fVar134 * fVar124;
              auVar91._28_4_ = fVar124;
              auVar112 = vcmpps_avx(local_940,auVar91,2);
              auVar107 = vandps_avx(auVar112,auVar107);
              auVar112 = auVar118 & auVar107;
              if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar112 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar112 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar112 >> 0x7f,0) != '\0') ||
                    (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar112 >> 0xbf,0) != '\0') ||
                  (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar112[0x1f] < '\0') {
                local_8e0 = vandps_avx(auVar118,auVar107);
                auVar107 = vsubps_avx(local_920,auVar147);
                local_980 = vblendvps_avx(auVar142,auVar107,local_9e0);
                auVar107 = vsubps_avx(local_920,auVar142);
                local_960 = vblendvps_avx(auVar147,auVar107,local_9e0);
                uStack_844 = local_9e0._28_4_;
                local_860[0] = fVar13 * (float)local_a00._0_4_;
                local_860[1] = fVar23 * (float)local_a00._4_4_;
                local_860[2] = fVar33 * fStack_9f8;
                local_860[3] = fVar43 * fStack_9f4;
                fStack_850 = fVar53 * fStack_9f0;
                fStack_84c = fVar63 * fStack_9ec;
                fStack_848 = fVar73 * fStack_9e8;
                local_840[0] = fVar12 * (float)local_a00._0_4_;
                local_840[1] = fVar22 * (float)local_a00._4_4_;
                local_840[2] = fVar32 * fStack_9f8;
                local_840[3] = fVar42 * fStack_9f4;
                fStack_830 = fVar52 * fStack_9f0;
                fStack_82c = fVar62 * fStack_9ec;
                fStack_828 = fVar72 * fStack_9e8;
                uStack_824 = uStack_844;
                auVar107 = vrcpps_avx(local_920);
                local_820[0] = (float)local_a00._0_4_ * fVar11;
                local_820[1] = (float)local_a00._4_4_ * fVar21;
                local_820[2] = fStack_9f8 * fVar31;
                local_820[3] = fStack_9f4 * fVar41;
                fStack_810 = fStack_9f0 * fVar51;
                fStack_80c = fStack_9ec * fVar61;
                fStack_808 = fStack_9e8 * fVar71;
                uStack_804 = uStack_844;
                fVar124 = auVar107._0_4_;
                fVar128 = auVar107._4_4_;
                auVar92._4_4_ = fVar130 * fVar128;
                auVar92._0_4_ = fVar129 * fVar124;
                fVar129 = auVar107._8_4_;
                auVar92._8_4_ = fVar131 * fVar129;
                fVar130 = auVar107._12_4_;
                auVar92._12_4_ = fVar133 * fVar130;
                fVar131 = auVar107._16_4_;
                auVar92._16_4_ = fVar135 * fVar131;
                fVar133 = auVar107._20_4_;
                auVar92._20_4_ = fVar132 * fVar133;
                fVar135 = auVar107._24_4_;
                auVar92._24_4_ = fVar134 * fVar135;
                auVar92._28_4_ = local_920._28_4_;
                auVar139._8_4_ = 0x3f800000;
                auVar139._0_8_ = 0x3f8000003f800000;
                auVar139._12_4_ = 0x3f800000;
                auVar139._16_4_ = 0x3f800000;
                auVar139._20_4_ = 0x3f800000;
                auVar139._24_4_ = 0x3f800000;
                auVar139._28_4_ = 0x3f800000;
                auVar107 = vsubps_avx(auVar139,auVar92);
                fVar124 = fVar124 + fVar124 * auVar107._0_4_;
                fVar128 = fVar128 + fVar128 * auVar107._4_4_;
                fVar129 = fVar129 + fVar129 * auVar107._8_4_;
                fVar130 = fVar130 + fVar130 * auVar107._12_4_;
                fVar131 = fVar131 + fVar131 * auVar107._16_4_;
                fVar133 = fVar133 + fVar133 * auVar107._20_4_;
                fVar135 = fVar135 + fVar135 * auVar107._24_4_;
                local_880._4_4_ = fVar128 * local_940._4_4_;
                local_880._0_4_ = fVar124 * local_940._0_4_;
                local_880._8_4_ = fVar129 * local_940._8_4_;
                local_880._12_4_ = fVar130 * local_940._12_4_;
                local_880._16_4_ = fVar131 * local_940._16_4_;
                local_880._20_4_ = fVar133 * local_940._20_4_;
                local_880._24_4_ = fVar135 * local_940._24_4_;
                local_880._28_4_ = local_940._28_4_;
                local_8c0[0] = local_980._0_4_ * fVar124;
                local_8c0[1] = local_980._4_4_ * fVar128;
                local_8c0[2] = local_980._8_4_ * fVar129;
                local_8c0[3] = local_980._12_4_ * fVar130;
                fStack_8b0 = local_980._16_4_ * fVar131;
                fStack_8ac = local_980._20_4_ * fVar133;
                fStack_8a8 = local_980._24_4_ * fVar135;
                uStack_8a4 = local_980._28_4_;
                local_8a0._4_4_ = local_960._4_4_ * fVar128;
                local_8a0._0_4_ = local_960._0_4_ * fVar124;
                local_8a0._8_4_ = local_960._8_4_ * fVar129;
                local_8a0._12_4_ = local_960._12_4_ * fVar130;
                local_8a0._16_4_ = local_960._16_4_ * fVar131;
                local_8a0._20_4_ = local_960._20_4_ * fVar133;
                local_8a0._24_4_ = local_960._24_4_ * fVar135;
                local_8a0._28_4_ = local_980._28_4_;
                uVar98 = vmovmskps_avx(local_8e0);
                uVar99 = (ulong)uVar98;
                do {
                  local_bc0 = 0;
                  if (uVar99 != 0) {
                    for (; (uVar99 >> local_bc0 & 1) == 0; local_bc0 = local_bc0 + 1) {
                    }
                  }
                  local_b68 = *(uint *)((long)&local_9a0 + local_bc0 * 4);
                  local_bc8 = (local_bd0->geometries).items[local_b68].ptr;
                  if ((local_bc8->mask & ray->mask) == 0) {
                    uVar99 = uVar99 ^ 1L << (local_bc0 & 0x3f);
                  }
                  else {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (local_bc8->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_002c4328;
                    local_ba0._0_8_ = context->args;
                    local_ae0._0_8_ = uVar99;
                    local_b20._0_8_ = uVar103;
                    local_ac0._0_8_ = puVar102;
                    local_b50.context = context->user;
                    local_b80 = local_860[local_bc0];
                    local_b7c = local_840[local_bc0];
                    local_b78 = local_820[local_bc0];
                    local_b74 = local_8c0[local_bc0];
                    local_b70 = *(undefined4 *)(local_8a0 + local_bc0 * 4);
                    local_b6c = *(undefined4 *)((long)&local_9c0 + local_bc0 * 4);
                    local_b64 = (local_b50.context)->instID[0];
                    local_b60 = (local_b50.context)->instPrimID[0];
                    fVar124 = ray->tfar;
                    ray->tfar = local_860[local_bc0 - 8];
                    local_bd4 = -1;
                    local_b50.valid = &local_bd4;
                    local_b50.geometryUserPtr = local_bc8->userPtr;
                    local_b00._0_8_ = ray;
                    local_b50.hit = (RTCHitN *)&local_b80;
                    local_b50.N = 1;
                    local_b50.ray = (RTCRayN *)ray;
                    if ((local_bc8->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*local_bc8->occlusionFilterN)(&local_b50), *local_b50.valid != 0)) {
                      ray = (Ray *)local_b00._0_8_;
                      if ((*(code **)(local_ba0._0_8_ + 0x10) == (code *)0x0) ||
                         (((*(byte *)local_ba0._0_8_ & 2) == 0 &&
                          (((local_bc8->field_8).field_0x2 & 0x40) == 0)))) {
LAB_002c4328:
                        ray->tfar = -INFINITY;
                        return;
                      }
                      (**(code **)(local_ba0._0_8_ + 0x10))(&local_b50);
                      ray = (Ray *)local_b00._0_8_;
                      if (*local_b50.valid != 0) goto LAB_002c4328;
                    }
                    *(float *)(local_b00._0_8_ + 0x20) = fVar124;
                    uVar99 = local_ae0._0_8_ ^ 1L << (local_bc0 & 0x3f);
                    ray = (Ray *)local_b00._0_8_;
                    puVar102 = (ulong *)local_ac0._0_8_;
                    uVar103 = local_b20._0_8_;
                  }
                } while (uVar99 != 0);
              }
            }
            local_bb8 = local_bb8 + 1;
          } while (local_bb8 != local_ba8);
        }
        auVar143 = ZEXT1664(local_a30);
        auVar145 = ZEXT1664(local_a40);
        auVar148 = ZEXT1664(local_a50);
        auVar156 = ZEXT1664(local_a60);
        auVar165 = ZEXT1664(local_a70);
        auVar123 = ZEXT1664(local_a80);
        auVar127 = ZEXT1664(local_a90);
        auVar140 = ZEXT1664(local_aa0);
        uVar99 = local_bb0;
      } while (puVar102 != &local_800);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }